

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator __position;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  void *pvVar3;
  ulong in_RSI;
  long in_RDI;
  void *ptr;
  void *ptr_1;
  size_t bs;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff68;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff80;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_40;
  void *local_38;
  ulong local_30;
  _Self local_28;
  _Self local_20;
  ulong local_18;
  
  local_18 = in_RSI;
  Mutex::lock((Mutex *)0x16a94d);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff68);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      Mutex::unlock((Mutex *)0x16aaca);
      pvVar3 = ncnn::fastMalloc((size_t)in_stack_ffffffffffffff70);
      Mutex::lock((Mutex *)0x16aaf1);
      std::make_pair<unsigned_long&,void*&>
                ((unsigned_long *)(*(long *)(in_RDI + 8) + 0x70),(void **)in_stack_ffffffffffffff68)
      ;
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      Mutex::unlock((Mutex *)0x16ab40);
      return pvVar3;
    }
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x16a99d);
    local_30 = ppVar2->first;
    if ((local_18 <= local_30) &&
       (local_30 * *(uint *)(*(long *)(in_RDI + 8) + 0x50) >> 8 <= local_18)) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_20);
  }
  ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x16a9e9);
  local_38 = ppVar2->second;
  __position._M_node = (_List_node_base *)(*(long *)(in_RDI + 8) + 0x58);
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_40,&local_20);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (in_stack_ffffffffffffff70,__position);
  Mutex::unlock((Mutex *)0x16aa3b);
  Mutex::lock((Mutex *)0x16aa4d);
  this_00 = (list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             *)(*(long *)(in_RDI + 8) + 0x70);
  std::make_pair<unsigned_long&,void*&>
            ((unsigned_long *)in_stack_ffffffffffffff70,(void **)in_stack_ffffffffffffff68);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(this_00,(value_type *)__position._M_node);
  Mutex::unlock((Mutex *)0x16aa99);
  return local_38;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}